

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_t * cmd_ln_parse_file_r(ps_config_t *inout_cmdln,ps_arg_t *defn,char *filename,int32 strict)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char **argv;
  cmd_ln_t *pcVar5;
  char **ppcVar6;
  long lVar7;
  ulong uVar8;
  uint argc;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  char separator [5];
  int local_74;
  char *local_70;
  undefined4 local_68;
  undefined1 local_64;
  ps_config_t *local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  int32 local_40;
  uint local_3c;
  ps_arg_t *local_38;
  
  local_64 = 0;
  local_68 = 0xa0d0920;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1b2,"Cannot open configuration file %s for reading\n",filename);
    return (cmd_ln_t *)0x0;
  }
  iVar3 = fgetc(__stream);
  if (iVar3 != -1) {
    do {
      pcVar4 = strchr((char *)&local_68,iVar3);
      if (pcVar4 == (char *)0x0) {
        local_40 = strict;
        local_38 = defn;
        argv = (char **)__ckd_calloc__(0x1e,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                       ,0x1c4);
        local_70 = (char *)__ckd_calloc__(0x201,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                          ,0x1c6);
        local_50 = 0x200;
        local_58 = 0x1e;
        argc = 0;
        local_74 = 0;
        bVar2 = false;
        goto LAB_0010b945;
      }
      iVar3 = fgetc(__stream);
    } while (iVar3 != -1);
  }
  fclose(__stream);
  return (cmd_ln_t *)0x0;
LAB_0010b945:
  local_3c = argc & 1;
  local_48 = 0;
  uVar10 = local_50;
  do {
    if ((int)local_48 == 0 && local_3c == 0) {
LAB_0010b96c:
      if (iVar3 == 0x23) {
        do {
          iVar3 = fgetc(__stream);
          if (iVar3 == 10) break;
        } while (iVar3 != -1);
        do {
          iVar3 = fgetc(__stream);
          if (iVar3 == -1) break;
          pcVar4 = strchr((char *)&local_68,iVar3);
        } while (pcVar4 != (char *)0x0);
        goto LAB_0010b96c;
      }
      if (iVar3 == -1) goto LAB_0010bbc7;
    }
    if ((iVar3 == 0x22) || (iVar3 == 0x27)) {
      if (local_74 == iVar3) {
        local_74 = 0;
      }
      else {
        bVar11 = local_74 != 0;
        local_74 = iVar3;
        if (bVar11) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x1dd,"Nesting quotations is not supported!\n");
          bVar2 = true;
          goto LAB_0010bbc7;
        }
      }
    }
    else {
      if ((iVar3 == -1) ||
         ((local_74 == 0 && (pcVar4 = strchr((char *)&local_68,iVar3), pcVar4 != (char *)0x0))))
      break;
      iVar9 = (int)uVar10;
      if (iVar9 <= (int)local_48) {
        local_60 = inout_cmdln;
        local_50 = uVar10;
        pcVar4 = (char *)__ckd_realloc__(local_70,(long)(iVar9 * 2 + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                         ,0x207);
        bVar11 = pcVar4 == (char *)0x0;
        if (bVar11) {
          pcVar4 = local_70;
        }
        uVar1 = iVar9 * 2;
        if (bVar11) {
          bVar2 = true;
          uVar1 = (uint)local_50;
        }
        uVar10 = (ulong)uVar1;
        local_70 = pcVar4;
        inout_cmdln = local_60;
        if (bVar11) goto LAB_0010bbc7;
      }
      lVar7 = (long)(int)local_48;
      local_48 = lVar7 + 1;
      local_70[lVar7] = (char)iVar3;
      local_70[lVar7 + 1] = '\0';
    }
    iVar3 = fgetc(__stream);
  } while( true );
  uVar8 = local_58;
  ppcVar6 = argv;
  local_60 = inout_cmdln;
  local_50 = uVar10;
  if ((int)local_58 <= (int)argc) {
    uVar1 = (int)local_58 * 2;
    ppcVar6 = (char **)__ckd_realloc__(argv,(long)(int)uVar1 * 8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                       ,0x1e9);
    if (ppcVar6 == (char **)0x0) {
      uVar1 = (uint)local_58;
    }
    uVar8 = (ulong)uVar1;
    if (ppcVar6 == (char **)0x0) {
      bVar2 = true;
      inout_cmdln = local_60;
LAB_0010bbc7:
      fclose(__stream);
      ckd_free(local_70);
      if (bVar2) {
        if (0 < (int)argc) {
          uVar10 = 0;
          do {
            ckd_free(argv[uVar10]);
            uVar10 = uVar10 + 1;
          } while (argc != uVar10);
        }
      }
      else {
        pcVar5 = cmd_ln_parse_r(inout_cmdln,local_38,argc,argv,local_40);
        if (pcVar5 != (cmd_ln_t *)0x0) {
          if (pcVar5 == inout_cmdln) {
            ppcVar6 = (char **)__ckd_realloc__(pcVar5->f_argv,(ulong)(pcVar5->f_argc + argc) << 3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                               ,0x119);
            pcVar5->f_argv = ppcVar6;
            memcpy(ppcVar6 + pcVar5->f_argc,argv,(long)(int)argc << 3);
            ckd_free(argv);
            pcVar5->f_argc = pcVar5->f_argc + argc;
            return pcVar5;
          }
          pcVar5->f_argc = argc;
          pcVar5->f_argv = argv;
          return pcVar5;
        }
        if (0 < (int)argc) {
          uVar10 = 0;
          do {
            ckd_free(argv[uVar10]);
            uVar10 = uVar10 + 1;
          } while (argc != uVar10);
        }
      }
      ckd_free(argv);
      return (cmd_ln_t *)0x0;
    }
  }
  local_58 = uVar8;
  pcVar4 = __ckd_salloc__(local_70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x1f2);
  ppcVar6[argc] = pcVar4;
  *local_70 = '\0';
  if (local_74 != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1f8,"Unclosed quotation, having EOF close it...\n");
  }
  inout_cmdln = local_60;
  argc = argc + 1;
  while( true ) {
    argv = ppcVar6;
    if (iVar3 == -1) goto LAB_0010bbc7;
    pcVar4 = strchr((char *)&local_68,iVar3);
    if (pcVar4 == (char *)0x0) break;
    iVar3 = fgetc(__stream);
  }
  goto LAB_0010b945;
}

Assistant:

ps_config_t *
cmd_ln_parse_file_r(ps_config_t *inout_cmdln, const ps_arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}